

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node_effects.cpp
# Opt level: O2

void __thiscall
PixelR8G8B8A8_GradApply<fe::PixelA8>::getPixel
          (PixelR8G8B8A8_GradApply<fe::PixelA8> *this,uchar *data,Pixel *p,int x,int y)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  ImageData *this_00;
  uchar *puVar4;
  int iVar5;
  int x_00;
  undefined1 auVar6 [16];
  
  auVar6 = ZEXT216(CONCAT11(*data,*data));
  auVar6 = pshuflw(auVar6,auVar6,0);
  (p->field_0).rgba = auVar6._0_4_;
  iVar5 = (int)((((float)x * (this->grad).plane.a + (float)y * (this->grad).plane.b) -
                (this->grad).plane.d) + this->d);
  iVar3 = (this->grad).image.w;
  x_00 = iVar3 + -1;
  if (iVar5 < iVar3) {
    x_00 = iVar5;
  }
  if (x_00 < 1) {
    x_00 = 0;
  }
  this_00 = asImage(&(this->grad).image);
  puVar4 = fe::ImageData::getPixelPtr(this_00,x_00,0);
  uVar1 = puVar4[2];
  bVar2 = puVar4[3];
  *(undefined2 *)&p->field_0 = *(undefined2 *)puVar4;
  (p->field_0).field_0.bytes[2] = uVar1;
  (p->field_0).field_0.bytes[3] =
       (uchar)(((uint)(p->field_0).field_0.bytes[3] * (uint)bVar2) / 0xff);
  return;
}

Assistant:

void getPixel(GET_PIXEL_ARGS) const
    {
        T::getPixel(GET_PIXEL_ARGS_PASS);

        PixelR8G8B8A8 gp;
        Pixel g;

        const fe_plane& plane = grad.plane;
        const fe_image& image = grad.image;

        float dist = x * plane.a + y * plane.b - plane.d + d;

        int gx = int(dist);
        if (gx >= image.w)
            gx = image.w - 1;
        if (gx < 0)
            gx = 0;

        gp.getPixel(asImage(&image)->getPixelPtr(gx, 0), g, OPERATOR_ARGS_PASS);

        p.r = g.r;
        p.g = g.g;
        p.b = g.b;
        p.a = (p.a * g.a) / 255;
    }